

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O2

bool __thiscall
dg::pta::PointerAnalysisFSInv::handleUninitialized
          (PointerAnalysisFSInv *this,MemoryMapT *mm,MemoryMapT *pm)

{
  _Base_ptr p_Var1;
  long lVar2;
  bool bVar3;
  iterator iVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  Pointer local_40;
  
  lVar2 = Offset::UNKNOWN;
  bVar7 = false;
  for (p_Var6 = (mm->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(mm->_M_t)._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    iVar4 = std::
            _Rb_tree<dg::pta::PSNode_*,_std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>,_std::_Select1st<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
            ::find(&pm->_M_t,(key_type *)(p_Var6 + 1));
    if ((_Rb_tree_header *)iVar4._M_node == &(pm->_M_t)._M_impl.super__Rb_tree_header) {
      p_Var1 = p_Var6[1]._M_parent;
      for (p_Var5 = *(_Rb_tree_node_base **)(p_Var1 + 1);
          p_Var5 != (_Rb_tree_node_base *)&p_Var1->_M_left;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        if (*(long *)(p_Var5 + 1) != lVar2) {
          local_40.target = INVALIDATED;
          local_40.offset.offset = 0;
          bVar3 = MemoryObject::addPointsTo
                            ((MemoryObject *)p_Var6[1]._M_parent,(Offset *)(p_Var5 + 1),&local_40);
          bVar7 = (bool)(bVar7 | bVar3);
        }
      }
    }
  }
  return bVar7;
}

Assistant:

bool handleUninitialized(MemoryMapT *mm, MemoryMapT *pm) {
        bool changed = false;
        for (auto &it : *mm) {
            auto pmit = pm->find(it.first);
            if (pmit == pm->end()) {
                for (auto &mit : *it.second) {
                    if (mit.first.isUnknown())
                        continue; // FIXME: we are optimistic here...
                    changed |= it.second->addPointsTo(mit.first,
                                                      Pointer{INVALIDATED, 0});
                }
                continue;
            }

            /* check the initialization of memory objects
            auto *pmo = pmit->second.get();
            for (auto &mit : *it.second) {
                if (pmo->find(mit.first) != pmo->end())
                    continue;
                if (mit.first.isUnknown())
                    continue; // FIXME: we are optimistic here...

                changed |= it.second->addPointsTo(mit.first,
                                                  Pointer{INVALIDATED, 0});
            }
            */
        }

        return changed;
    }